

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall VarianceEstimator_MergeTwo_Test::TestBody(VarianceEstimator_MergeTwo_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  long lVar4;
  byte bVar5;
  uint64_t oldstate;
  undefined1 *puVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  float fVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined4 in_XMM13_Da;
  undefined4 in_XMM13_Db;
  undefined8 in_XMM13_Qb;
  AssertionResult gtest_ar;
  Float varError;
  Float meanErr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  double local_30;
  double local_28;
  float local_20;
  float local_1c;
  
  puVar6 = &DAT_5851f42d4c957f2e;
  auVar31 = ZEXT864(0) << 0x40;
  lVar10 = 0;
  auVar19 = ZEXT864(0) << 0x40;
  dVar17 = 0.0;
  lVar4 = 0;
  dVar12 = 0.0;
  auVar30 = ZEXT864(0) << 0x40;
  lVar7 = 0;
  auVar16 = ZEXT864(0) << 0x40;
  do {
    uVar8 = (uint)((ulong)puVar6 >> 0x2d) ^ (uint)((ulong)puVar6 >> 0x1b);
    bVar5 = (byte)((ulong)puVar6 >> 0x3b);
    auVar11._4_4_ = in_XMM13_Db;
    auVar11._0_4_ = in_XMM13_Da;
    auVar11._8_8_ = in_XMM13_Qb;
    auVar11 = vcvtusi2ss_avx512f(auVar11,uVar8 >> bVar5 | uVar8 << 0x20 - bVar5);
    auVar11 = vminss_avx(ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    fVar21 = (auVar11._0_4_ + (float)(int)(uint)lVar7) / 1000.0;
    fVar21 = fVar21 * fVar21 * fVar21;
    dVar24 = (double)fVar21;
    if ((uint)lVar7 < 400) {
      lVar10 = lVar10 + 1;
      dVar22 = dVar24 - auVar16._0_8_;
      dVar14 = dVar22 / (double)lVar10 + auVar16._0_8_;
      auVar16 = ZEXT864((ulong)dVar14);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar24 - dVar14;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar22;
      auVar11 = vfmadd231sd_fma(auVar31._0_16_,auVar27,auVar25);
      auVar31 = ZEXT1664(auVar11);
    }
    else {
      lVar4 = lVar4 + 1;
      dVar14 = dVar24 - dVar17;
      dVar17 = dVar14 / (double)lVar4 + dVar17;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar24 - dVar17;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar14;
      auVar11 = vfmadd231sd_fma(auVar19._0_16_,auVar28,auVar26);
      auVar19 = ZEXT1664(auVar11);
    }
    dVar14 = auVar16._0_8_;
    puVar6 = (undefined1 *)((long)puVar6 * 0x5851f42d4c957f2d + 1);
    lVar7 = lVar7 + 1;
    dVar22 = (double)fVar21;
    dVar24 = dVar22 - dVar12;
    dVar12 = dVar24 / (double)lVar7 + dVar12;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar22 - dVar12;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar24;
    auVar11 = vfmadd231sd_fma(auVar30._0_16_,auVar29,auVar23);
    auVar30 = ZEXT1664(auVar11);
  } while (lVar7 != 1000);
  local_28 = auVar11._0_8_;
  local_30 = auVar31._0_8_;
  if (lVar4 != 0) {
    auVar20._0_8_ = (double)lVar10;
    auVar20._8_8_ = in_XMM13_Qb;
    lVar10 = lVar10 + lVar4;
    local_30 = local_30 + auVar19._0_8_ +
               ((dVar17 - dVar14) * (dVar17 - dVar14) * auVar20._0_8_ * (double)lVar4) /
               (double)lVar10;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar17 * (double)lVar4;
    auVar11 = vfmadd231sd_fma(auVar18,auVar20,auVar16._0_16_);
    dVar14 = auVar11._0_8_ / (double)lVar10;
  }
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar14 - dVar12;
  auVar11 = vandpd_avx512vl(auVar15,auVar1);
  local_1c = (float)(auVar11._0_8_ / dVar12);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<float,double>
            (local_40,"meanErr","1e-5",&local_1c,(double *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3d3,pcVar9);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (double)((ulong)(1 < lVar10) * (long)(local_30 / (double)(lVar10 + -1))) - local_28 / 999.0;
  auVar11 = vandpd_avx512vl(auVar13,auVar2);
  local_20 = (float)(auVar11._0_8_ / (local_28 / 999.0));
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<float,double>
            (local_40,"varError","1e-5",&local_20,(double *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3d6,pcVar9);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VarianceEstimator, MergeTwo) {
    VarianceEstimator<double> ve[2], veBoth;

    int index = 0;
    for (Float u : Stratified1D(1000)) {
        if (index++ < 400)
            ve[0].Add(u * u * u);
        else
            ve[1].Add(u * u * u);
        veBoth.Add(u * u * u);
    }

    ve[0].Merge(ve[1]);

    Float meanErr = std::abs(ve[0].Mean() - veBoth.Mean()) / veBoth.Mean();
    EXPECT_LT(meanErr, 1e-5);

    Float varError = std::abs(ve[0].Variance() - veBoth.Variance()) / veBoth.Variance();
    EXPECT_LT(varError, 1e-5);
}